

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wputils.c
# Opt level: O1

uint32_t read_next_header(read_stream infile,WavpackHeader *wphdr)

{
  int32_t iVar1;
  uint32_t uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t uVar6;
  long in_FS_OFFSET;
  char buffer [32];
  char local_58 [10];
  undefined6 uStack_4e;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  uVar3 = 0x20;
  while( true ) {
    uVar5 = 0;
    if (uVar3 < 0x20) {
      uVar5 = (ulong)(0x20 - (int)uVar3);
      __memcpy_chk(local_58,local_58 + uVar3,uVar5,0x20);
    }
    iVar4 = 0x20 - (int)uVar5;
    iVar1 = (*infile)(local_58 + uVar5,iVar4);
    uVar2 = 0xffffffff;
    if (iVar1 != iVar4) goto LAB_001b3c19;
    uVar3 = 1;
    if ((((((local_58[0] == 'w') && (local_58[1] == 'v')) && (uVar3 = 2, local_58[2] == 'p')) &&
         ((uVar3 = 3, local_58[3] == 'k' && (uVar3 = 4, (local_58[4] & 1U) == 0)))) &&
        ((local_58[6] < '\x10' && ((local_58[7] == '\0' && (local_58[9] == '\x04')))))) &&
       ((byte)(local_58[8] - 2U) < 0xf)) break;
    do {
      if (local_58[uVar3] == 'w') goto LAB_001b3c09;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x20);
    uVar3 = 0x20;
LAB_001b3c09:
    uVar6 = uVar6 + (int)uVar3;
    if (0x100000 < uVar6) {
LAB_001b3c19:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return uVar2;
      }
      __stack_chk_fail();
    }
  }
  uVar3 = (ulong)CONCAT16(local_58[6],CONCAT15(local_58[5],CONCAT14(local_58[4],0x6b707677)));
  wphdr->block_index = (undefined4)local_48;
  wphdr->block_samples = local_48._4_4_;
  wphdr->flags = (undefined4)uStack_40;
  wphdr->crc = uStack_40._4_4_;
  wphdr->ckID[0] = (char)uVar3;
  wphdr->ckID[1] = (char)(uVar3 >> 8);
  wphdr->ckID[2] = (char)(uVar3 >> 0x10);
  wphdr->ckID[3] = (char)(uVar3 >> 0x18);
  wphdr->ckSize = (int)(uVar3 >> 0x20);
  wphdr->version = CONCAT11(4,local_58[8]);
  wphdr->track_no = (char)uStack_4e;
  wphdr->index_no = (char)((uint6)uStack_4e >> 8);
  wphdr->total_samples = (int)((uint6)uStack_4e >> 0x10);
  little_endian_to_native(wphdr,"4LS2LLLLL");
  uVar2 = uVar6;
  goto LAB_001b3c19;
}

Assistant:

static uint32_t read_next_header (read_stream infile, WavpackHeader *wphdr)
{
    char buffer [sizeof (*wphdr)], *sp = buffer + sizeof (*wphdr), *ep = sp;
    uint32_t bytes_skipped = 0;
    int bleft;

    while (1) {
        if (sp < ep) {
            bleft = ep - sp;
            memcpy (buffer, sp, bleft);
        }
        else
            bleft = 0;

        if (infile (buffer + bleft, sizeof (*wphdr) - bleft) != (int32_t) sizeof (*wphdr) - bleft)
            return -1;

        sp = buffer;

        if (*sp++ == 'w' && *sp == 'v' && *++sp == 'p' && *++sp == 'k' &&
            !(*++sp & 1) && sp [2] < 16 && !sp [3] && sp [5] == 4 &&
            sp [4] >= (MIN_STREAM_VERS & 0xff) && sp [4] <= (MAX_STREAM_VERS & 0xff)) {
                memcpy (wphdr, buffer, sizeof (*wphdr));
                little_endian_to_native (wphdr, WavpackHeaderFormat);
                return bytes_skipped;
            }

        while (sp < ep && *sp != 'w')
            sp++;

        if ((bytes_skipped += sp - buffer) > 1048576L)
            return -1;
    }
}